

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::Variable::display(Variable *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  Variable *in_RDI;
  Displayable *in_stack_ffffffffffffffa8;
  Displayable *val;
  ostream *in_stack_ffffffffffffffb0;
  Displayable local_20 [2];
  ostream *local_10;
  Variable *this_00;
  
  local_10 = in_RSI;
  this_00 = in_RDI;
  std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffffb0);
  prelude::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((in_RDI->is_memory_var & 1U) != 0) {
    poVar1 = std::operator<<(local_10," memory (");
    val = local_20;
    type(this_00);
    std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               poVar1);
    poVar1 = prelude::operator<<(poVar1,val);
    std::operator<<(poVar1,")");
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2bdd46);
  }
  if ((in_RDI->is_temp_var & 1U) != 0) {
    std::operator<<(local_10," temp");
  }
  poVar1 = std::operator<<(local_10,", priority: ");
  std::ostream::operator<<(poVar1,in_RDI->priority);
  return;
}

Assistant:

void Variable::display(std::ostream& o) const {
  o << *ty;
  if (is_memory_var) {
    o << " memory (" << *(type()) << ")";
  }
  if (is_temp_var) {
    o << " temp";
  }
  o << ", priority: " << priority;
}